

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O3

void bsdcat_read_to_stdout(char *filename)

{
  char *pcVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  
  wVar2 = archive_read_open_filename(a,filename,0x2800);
  if (wVar2 == L'\0') {
    iVar3 = archive_read_next_header(a,&ae);
    if (iVar3 == 0) {
      iVar3 = archive_read_data_into_fd(a,1);
      if (iVar3 == 0) goto LAB_001066d5;
    }
  }
  pcVar1 = bsdcat_current_path;
  pcVar4 = archive_error_string(a);
  lafe_warnc(0,"%s: %s",pcVar1,pcVar4);
  exit_status = 1;
LAB_001066d5:
  iVar3 = archive_read_free(a);
  pcVar1 = bsdcat_current_path;
  if (iVar3 != 0) {
    pcVar4 = archive_error_string(a);
    lafe_warnc(0,"%s: %s",pcVar1,pcVar4);
    exit_status = 1;
  }
  return;
}

Assistant:

void
bsdcat_read_to_stdout(char* filename)
{
	if ((archive_read_open_filename(a, filename, BYTES_PER_BLOCK) != ARCHIVE_OK)
	    || (archive_read_next_header(a, &ae) != ARCHIVE_OK)
	    || (archive_read_data_into_fd(a, 1) != ARCHIVE_OK))
		bsdcat_print_error();
	if (archive_read_free(a) != ARCHIVE_OK)
		bsdcat_print_error();
}